

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::MaybeWarnCMP0074(cmMakefile *this,string *pkg)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  PolicyID id;
  bool bVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  byte local_272;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  ostringstream w;
  undefined1 local_70 [6];
  bool haveEnv;
  bool haveVar;
  string env;
  char *var;
  string varName;
  string *pkg_local;
  cmMakefile *this_local;
  
  varName.field_2._8_8_ = pkg;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,pkg,
                 "_ROOT");
  pcVar2 = GetDefinition(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &var);
  std::__cxx11::string::string((string *)local_70);
  cmsys::SystemTools::GetEnv((string *)&var,(string *)local_70);
  bVar4 = false;
  if (pcVar2 != (char *)0x0) {
    bVar4 = *pcVar2 != '\0';
  }
  bVar1 = std::__cxx11::string::empty();
  bVar1 = (bVar1 ^ 0xff) & 1;
  if ((bVar4) || (local_272 = 0, bVar1 != 0)) {
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->WarnedCMP0074,(value_type *)&var);
    local_272 = pVar5.second;
  }
  if ((local_272 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_230,(cmPolicies *)0x4a,id);
    poVar3 = std::operator<<((ostream *)local_210,(string *)&local_230);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_230);
    if (bVar4) {
      poVar3 = std::operator<<((ostream *)local_210,"CMake variable ");
      poVar3 = std::operator<<(poVar3,(string *)&var);
      poVar3 = std::operator<<(poVar3," is set to:\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,pcVar2);
      std::operator<<(poVar3,"\n");
    }
    if (bVar1 != 0) {
      poVar3 = std::operator<<((ostream *)local_210,"Environment variable ");
      poVar3 = std::operator<<(poVar3,(string *)&var);
      poVar3 = std::operator<<(poVar3," is set to:\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<((ostream *)local_210,"For compatibility, CMake is ignoring the variable.");
    std::__cxx11::ostringstream::str();
    IssueMessage(this,AUTHOR_WARNING,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&var);
  return;
}

Assistant:

void cmMakefile::MaybeWarnCMP0074(std::string const& pkg)
{
  // Warn if a <pkg>_ROOT variable we may use is set.
  std::string const varName = pkg + "_ROOT";
  const char* var = this->GetDefinition(varName);
  std::string env;
  cmSystemTools::GetEnv(varName, env);

  bool const haveVar = var && *var;
  bool const haveEnv = !env.empty();
  if ((haveVar || haveEnv) && this->WarnedCMP0074.insert(varName).second) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0074) << "\n";
    if (haveVar) {
      w << "CMake variable " << varName << " is set to:\n"
        << "  " << var << "\n";
    }
    if (haveEnv) {
      w << "Environment variable " << varName << " is set to:\n"
        << "  " << env << "\n";
    }
    w << "For compatibility, CMake is ignoring the variable.";
    this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
}